

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O1

uint aom_highbd_8_obmc_variance16x16_c
               (uint8_t *pre,int pre_stride,int32_t *wsrc,int32_t *mask,uint *sse)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  
  lVar5 = (long)pre * 2;
  iVar4 = 0;
  uVar1 = 0;
  iVar6 = 0;
  do {
    lVar7 = 0;
    do {
      iVar2 = wsrc[lVar7] - (uint)*(ushort *)(lVar5 + lVar7 * 2) * mask[lVar7];
      if (iVar2 < 0) {
        uVar3 = -(0x800U - iVar2 >> 0xc);
      }
      else {
        uVar3 = iVar2 + 0x800U >> 0xc;
      }
      iVar4 = iVar4 + uVar3;
      uVar1 = uVar1 + uVar3 * uVar3;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x10);
    wsrc = wsrc + 0x10;
    mask = mask + 0x10;
    iVar6 = iVar6 + 1;
    lVar5 = lVar5 + (long)pre_stride * 2;
  } while (iVar6 != 0x10);
  *sse = uVar1;
  return uVar1 - (int)((ulong)((long)iVar4 * (long)iVar4) >> 8);
}

Assistant:

static inline void highbd_obmc_variance64(const uint8_t *pre8, int pre_stride,
                                          const int32_t *wsrc,
                                          const int32_t *mask, int w, int h,
                                          uint64_t *sse, int64_t *sum) {
  int i, j;
  uint16_t *pre = CONVERT_TO_SHORTPTR(pre8);
  uint64_t tsse = 0;
  int64_t tsum = 0;

  for (i = 0; i < h; i++) {
    for (j = 0; j < w; j++) {
      int diff = ROUND_POWER_OF_TWO_SIGNED(wsrc[j] - pre[j] * mask[j], 12);
      tsum += diff;
      tsse += diff * diff;
    }

    pre += pre_stride;
    wsrc += w;
    mask += w;
  }
  *sse = tsse;
  *sum = tsum;
}